

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> __thiscall
qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
          (pl *this,unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link,
          action_e *args,uint *args_1)

{
  pointer pLVar1;
  unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_> local_38;
  pointer local_30;
  Pipeline *next;
  uint *args_local_1;
  action_e *args_local;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link_local;
  
  next = (Pipeline *)args_1;
  args_local_1 = args;
  args_local = (action_e *)link;
  link_local = (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)this;
  pLVar1 = std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::operator->(link);
  local_30 = std::unique_ptr<Pipeline,_std::default_delete<Pipeline>_>::get(&pLVar1->next_pl);
  std::make_unique<Pl_PNGFilter,char_const(&)[1],Pipeline*&,Pl_PNGFilter::action_e,unsigned_int&>
            ((char (*) [1])&local_38,(Pipeline **)0x42fab6,(action_e *)&local_30,args_local_1);
  std::
  make_unique<qpdf::pl::Link,std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>,std::unique_ptr<Pl_PNGFilter,std::default_delete<Pl_PNGFilter>>>
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)this,
             (unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_> *)link);
  std::unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_>::~unique_ptr(&local_38);
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Link>
    create(std::unique_ptr<Link> link, Args&&... args)
    {
        auto* next = link->next_pl.get();
        return std::make_unique<Link>(
            std::move(link), std::make_unique<P>("", next, std::forward<Args>(args)...));
    }